

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ida_io.c
# Opt level: O1

int IDAGetRootInfo(void *ida_mem,int *rootsfound)

{
  int iVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  
  if (ida_mem == (void *)0x0) {
    iVar4 = -0x14;
    IDAProcessError((IDAMem)0x0,-0x14,0x50d,"IDAGetRootInfo",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/ida/ida_io.c"
                    ,"ida_mem = NULL illegal.");
  }
  else {
    iVar1 = *(int *)((long)ida_mem + 0x438);
    if ((long)iVar1 < 1) {
      iVar4 = 0;
    }
    else {
      lVar2 = *(long *)((long)ida_mem + 0x440);
      iVar4 = 0;
      lVar3 = 0;
      do {
        rootsfound[lVar3] = *(int *)(lVar2 + lVar3 * 4);
        lVar3 = lVar3 + 1;
      } while (iVar1 != lVar3);
    }
  }
  return iVar4;
}

Assistant:

int IDAGetRootInfo(void* ida_mem, int* rootsfound)
{
  IDAMem IDA_mem;
  int i, nrt;

  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDA_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (IDA_MEM_NULL);
  }

  IDA_mem = (IDAMem)ida_mem;

  nrt = IDA_mem->ida_nrtfn;

  for (i = 0; i < nrt; i++) { rootsfound[i] = IDA_mem->ida_iroots[i]; }

  return (IDA_SUCCESS);
}